

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

void __thiscall cmState::RemoveUserDefinedCommands(cmState *this)

{
  char cVar1;
  _Base_ptr p_Var2;
  iterator __position;
  _Self __tmp;
  
  __position._M_node = (this->Commands)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    while( true ) {
      if ((_Rb_tree_header *)__position._M_node ==
          &(this->Commands)._M_t._M_impl.super__Rb_tree_header) {
        return;
      }
      cVar1 = (**(code **)(**(long **)(__position._M_node + 2) + 0x18))
                        (*(long **)(__position._M_node + 2),"cmMacroHelperCommand");
      if (cVar1 == '\0') break;
LAB_00307f3f:
      if (*(long **)(__position._M_node + 2) != (long *)0x0) {
        (**(code **)(**(long **)(__position._M_node + 2) + 8))();
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCommand*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCommand*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
      ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCommand*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCommand*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>
                          *)&this->Commands,__position);
      __position._M_node = p_Var2;
    }
    cVar1 = (**(code **)(**(long **)(__position._M_node + 2) + 0x18))
                      (*(long **)(__position._M_node + 2),"cmFunctionHelperCommand");
    if (cVar1 != '\0') goto LAB_00307f3f;
    __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
  } while( true );
}

Assistant:

void cmState::RemoveUserDefinedCommands()
{
  for(std::map<std::string, cmCommand*>::iterator j = this->Commands.begin();
      j != this->Commands.end(); )
    {
    if (j->second->IsA("cmMacroHelperCommand") ||
        j->second->IsA("cmFunctionHelperCommand"))
      {
      delete j->second;
      this->Commands.erase(j++);
      }
    else
      {
      ++j;
      }
    }
}